

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

int move_towards(int8_t max,int rc,uint8_t *second,uint8_t *first)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  
  bVar1 = *first;
  if (bVar1 == *second) {
    return rc + 1;
  }
  iVar3 = (uint)bVar1 - (uint)*second;
  if (-1 < iVar3) {
    if (iVar3 < max) {
      max = (int8_t)iVar3;
    }
    *first = bVar1 - max;
    return rc;
  }
  cVar2 = (char)-iVar3;
  if ((int)max <= -iVar3) {
    cVar2 = max;
  }
  *first = cVar2 + bVar1;
  return rc;
}

Assistant:

int move_towards(int8_t         max,
                 int            rc,
                 const uint8_t *second,
                 uint8_t       *first)
{
  int delta; /* was A */

  assert(max == 2 || max == 6);
  assert(rc < 2); /* Should not be called with otherwise. */
  assert(second != NULL);
  assert(first  != NULL);

  delta = *first - *second;
  if (delta == 0)
  {
    rc++;
  }
  else if (delta < 0) // delta -ve => second > first
  {
    delta = -delta; /* absolute value */
    if (delta >= max)
      delta = max;
    *first += delta; // move first towards second
  }
  else // delta +ve => first > second
  {
    if (delta >= max)
      delta = max;
    *first -= delta; // move first towards second
  }

  return rc;
}